

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall
mpt::typed_array<mpt::message_store::entry>::insert
          (typed_array<mpt::message_store::entry> *this,long pos,entry *val)

{
  content<mpt::message_store::entry> *pcVar1;
  bool bVar2;
  array *this_00;
  ulong uVar3;
  
  pcVar1 = (this->super_unique_array<mpt::message_store::entry>)._ref._ref;
  if (pcVar1 == (content<mpt::message_store::entry> *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (pcVar1->super_buffer)._used >> 3;
  }
  if (pos < 0) {
    pos = pos + uVar3;
    if (pos < 0) {
      return false;
    }
  }
  else if (uVar3 <= (ulong)pos) {
    uVar3 = pos;
  }
  bVar2 = unique_array<mpt::message_store::entry>::reserve
                    (&this->super_unique_array<mpt::message_store::entry>,uVar3 + 1);
  if ((bVar2) &&
     (this_00 = (array *)content<mpt::message_store::entry>::insert
                                   ((this->super_unique_array<mpt::message_store::entry>)._ref._ref,
                                    pos), this_00 != (array *)0x0)) {
    array::array(this_00,&val->super_array);
    return true;
  }
  return false;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}